

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i32_Load16s(w3Interp *this)

{
  short *psVar1;
  w3Interp *this_local;
  
  psVar1 = (short *)LoadStore(this,2);
  w3Stack::push_i32(&this->super_w3Stack,(int)*psVar1);
  return;
}

Assistant:

INTERP (i32_Load16s)
{
    push_i32 (*(int16_t*)LoadStore (2));
}